

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O3

int __thiscall
Signal<std::shared_ptr<Transcript>_>::ConnectMember<Model>
          (Signal<std::shared_ptr<Transcript>_> *this,Model *inst,offset_in_Model_to_subr func)

{
  int iVar1;
  undefined8 in_RCX;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(Model **)local_48._M_unused._0_8_ = inst;
  *(offset_in_Model_to_subr *)((long)local_48._M_unused._0_8_ + 8) = func;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x10) = in_RCX;
  local_30 = std::
             _Function_handler<void_(std::shared_ptr<Transcript>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clauswilke[P]pinetree/src/pinetree/event_signal.hpp:29:20)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(std::shared_ptr<Transcript>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clauswilke[P]pinetree/src/pinetree/event_signal.hpp:29:20)>
             ::_M_manager;
  iVar1 = Connect(this,(function<void_(std::shared_ptr<Transcript>)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return iVar1;
}

Assistant:

int ConnectMember(T *inst, void (T::*func)(Args...)) {
    return Connect([=](Args... args) { (inst->*func)(args...); });
  }